

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_scan_tag_uri
              (yaml_parser_t *parser,int directive,yaml_char_t *head,yaml_mark_t start_mark,
              yaml_char_t **uri)

{
  char cVar1;
  size_t *psVar2;
  byte *pbVar3;
  byte bVar4;
  yaml_char_t *pyVar5;
  size_t sVar6;
  size_t sVar7;
  byte *pbVar8;
  size_t sVar9;
  char cVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  byte *pbVar15;
  ulong uVar16;
  byte bVar17;
  char *pcVar18;
  char *pcVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  byte *local_60;
  byte *local_58;
  byte *pbStack_50;
  int local_44;
  yaml_mark_t *local_40;
  yaml_char_t **local_38;
  
  if (head == (yaml_char_t *)0x0) {
    sVar14 = 0;
  }
  else {
    sVar14 = strlen((char *)head);
  }
  local_58 = (byte *)0x0;
  pbStack_50 = (byte *)0x0;
  local_60 = (byte *)yaml_malloc(0x10);
  if (local_60 != (byte *)0x0) {
    local_58 = local_60 + 0x10;
    local_60[0] = 0;
    local_60[1] = 0;
    local_60[2] = 0;
    local_60[3] = 0;
    local_60[4] = 0;
    local_60[5] = 0;
    local_60[6] = 0;
    local_60[7] = 0;
    local_60[8] = 0;
    local_60[9] = 0;
    local_60[10] = 0;
    local_60[0xb] = 0;
    local_60[0xc] = 0;
    local_60[0xd] = 0;
    local_60[0xe] = 0;
    local_60[0xf] = 0;
    pbStack_50 = local_60;
    local_44 = directive;
    local_38 = uri;
    do {
      if (sVar14 < (ulong)((long)local_58 - (long)local_60)) {
        if (1 < sVar14) {
          memcpy(local_60,head + 1,sVar14 - 1);
          pbStack_50 = pbStack_50 + (sVar14 - 1);
        }
        if ((parser->unread == 0) && (iVar12 = yaml_parser_update_buffer(parser,1), iVar12 == 0))
        goto LAB_0010ec0d;
        local_40 = &parser->mark;
        goto LAB_0010ec71;
      }
      iVar12 = yaml_string_extend(&local_60,&pbStack_50,&local_58);
    } while (iVar12 != 0);
  }
LAB_0010ec07:
  parser->error = YAML_MEMORY_ERROR;
  goto LAB_0010ec0d;
LAB_0010ec71:
  do {
    pbVar15 = (parser->buffer).pointer;
    bVar17 = *pbVar15;
    if (((byte)(bVar17 - 0x30) < 10) || ((byte)((bVar17 & 0xdf) + 0xbf) < 0x1a)) {
LAB_0010ecb2:
      if (local_58 <= pbStack_50 + 5) {
        iVar12 = yaml_string_extend(&local_60,&pbStack_50,&local_58);
        if (iVar12 == 0) goto LAB_0010ec07;
        pbVar15 = (parser->buffer).pointer;
        bVar17 = *pbVar15;
      }
      if ((char)bVar17 < '\0') {
        if ((bVar17 & 0xe0) == 0xc0) {
LAB_0010ed5d:
          (parser->buffer).pointer = pbVar15 + 1;
          *pbStack_50 = *pbVar15;
          pbVar15 = (parser->buffer).pointer;
          pbStack_50 = pbStack_50 + 1;
          goto LAB_0010ed81;
        }
        if ((bVar17 & 0xf0) == 0xe0) {
LAB_0010ed39:
          (parser->buffer).pointer = pbVar15 + 1;
          *pbStack_50 = *pbVar15;
          pbVar15 = (parser->buffer).pointer;
          pbStack_50 = pbStack_50 + 1;
          goto LAB_0010ed5d;
        }
        if ((bVar17 & 0xf8) == 0xf0) {
          (parser->buffer).pointer = pbVar15 + 1;
          *pbStack_50 = *pbVar15;
          pbVar15 = (parser->buffer).pointer;
          pbStack_50 = pbStack_50 + 1;
          goto LAB_0010ed39;
        }
      }
      else {
LAB_0010ed81:
        (parser->buffer).pointer = pbVar15 + 1;
        *pbStack_50 = *pbVar15;
        pbStack_50 = pbStack_50 + 1;
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar2 = &(parser->mark).column;
      *psVar2 = *psVar2 + 1;
      uVar16 = parser->unread - 1;
      parser->unread = uVar16;
    }
    else {
      uVar20 = bVar17 - 0x21;
      if (0x3e < uVar20) {
LAB_0010f0d7:
        if (bVar17 == 0x7e) goto LAB_0010ecb2;
        if (sVar14 != 0) {
          *local_38 = local_60;
          return 1;
        }
        if ((local_58 <= pbStack_50 + 5) &&
           (iVar12 = yaml_string_extend(&local_60,&pbStack_50,&local_58), iVar12 == 0))
        goto LAB_0010ec07;
        pcVar19 = "while parsing a %TAG directive";
        if (local_44 == 0) {
          pcVar19 = "while parsing a tag";
        }
        parser->error = YAML_SCANNER_ERROR;
        parser->context = pcVar19;
        (parser->context_mark).index = start_mark.index;
        (parser->context_mark).line = start_mark.line;
        (parser->context_mark).column = start_mark.column;
        parser->problem = "did not find expected tag URI";
LAB_0010f145:
        sVar6 = local_40->line;
        (parser->problem_mark).index = local_40->index;
        (parser->problem_mark).line = sVar6;
        (parser->problem_mark).column = local_40->column;
        break;
      }
      if ((0x54000000d6007fe9U >> ((ulong)uVar20 & 0x3f) & 1) != 0) goto LAB_0010ecb2;
      if ((ulong)uVar20 != 4) goto LAB_0010f0d7;
      if ((local_58 <= pbStack_50 + 5) &&
         (iVar12 = yaml_string_extend(&local_60,&pbStack_50,&local_58), iVar12 == 0))
      goto LAB_0010ec07;
      uVar16 = parser->unread;
      iVar12 = 0;
      do {
        if ((uVar16 < 3) && (iVar13 = yaml_parser_update_buffer(parser,3), iVar13 == 0))
        goto LAB_0010ec0d;
        pyVar5 = (parser->buffer).pointer;
        if ((*pyVar5 != '%') ||
           ((bVar17 = pyVar5[1], 9 < (byte)(bVar17 - 0x30) &&
            ((0x25 < bVar17 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar17 - 0x41) & 0x3f) & 1) == 0))
            )))) {
LAB_0010f0fc:
          pcVar19 = "did not find URI escaped octet";
LAB_0010f10c:
          pcVar18 = "while parsing a %TAG directive";
          if (local_44 == 0) {
            pcVar18 = "while parsing a tag";
          }
          parser->error = YAML_SCANNER_ERROR;
          parser->context = pcVar18;
          (parser->context_mark).index = start_mark.index;
          (parser->context_mark).line = start_mark.line;
          (parser->context_mark).column = start_mark.column;
          parser->problem = pcVar19;
          goto LAB_0010f145;
        }
        bVar4 = pyVar5[2];
        if ((9 < (byte)(bVar4 - 0x30)) &&
           ((0x25 < bVar4 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar4 - 0x41) & 0x3f) & 1) == 0))))
        goto LAB_0010f0fc;
        cVar1 = bVar17 * '\x10' + -0x70;
        cVar10 = bVar17 * '\x10';
        if ((byte)(bVar17 + 0xbf) < 6) {
          cVar10 = cVar1;
        }
        if (0x60 < bVar17) {
          cVar10 = cVar1;
        }
        bVar17 = bVar4 + 0xa9;
        if (bVar4 < 0x61) {
          bVar17 = bVar4 - 0x30;
        }
        bVar11 = bVar4 - 0x37;
        if (5 < (byte)(bVar4 + 0xbf)) {
          bVar11 = bVar17;
        }
        bVar11 = bVar11 + cVar10;
        if (iVar12 != 0) {
          pcVar19 = "found an incorrect trailing UTF-8 octet";
          goto LAB_0010f10c;
        }
        iVar12 = 1;
        if (((((char)bVar11 < '\0') && (iVar12 = 2, (bVar11 & 0xe0) != 0xc0)) &&
            (iVar12 = 3, (bVar11 & 0xf0) != 0xe0)) && (iVar12 = 4, (bVar11 & 0xf8) != 0xf0)) {
          pcVar19 = "found an incorrect leading UTF-8 octet";
          goto LAB_0010f10c;
        }
        pbVar15 = pbStack_50 + 1;
        *pbStack_50 = bVar11;
        sVar6 = (parser->mark).index;
        (parser->mark).index = sVar6 + 1;
        sVar7 = (parser->mark).column;
        (parser->mark).column = sVar7 + 1;
        pbVar8 = (parser->buffer).pointer;
        sVar9 = parser->unread;
        parser->unread = sVar9 - 1;
        bVar17 = *pbVar8;
        lVar21 = 1;
        lVar22 = 1;
        if ((((char)bVar17 < '\0') && (lVar22 = 2, (bVar17 & 0xe0) != 0xc0)) &&
           (lVar22 = 3, (bVar17 & 0xf0) != 0xe0)) {
          lVar22 = (ulong)((bVar17 & 0xf8) == 0xf0) << 2;
        }
        pbVar3 = pbVar8 + lVar22;
        (parser->buffer).pointer = pbVar3;
        (parser->mark).index = sVar6 + 2;
        (parser->mark).column = sVar7 + 2;
        parser->unread = sVar9 - 2;
        bVar17 = pbVar8[lVar22];
        if ((((char)bVar17 < '\0') && (lVar21 = 2, (bVar17 & 0xe0) != 0xc0)) &&
           (lVar21 = 3, (bVar17 & 0xf0) != 0xe0)) {
          lVar21 = (ulong)((bVar17 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar3 + lVar21;
        (parser->mark).index = sVar6 + 3;
        (parser->mark).column = sVar7 + 3;
        uVar16 = sVar9 - 3;
        parser->unread = uVar16;
        bVar17 = pbVar3[lVar21];
        lVar22 = 1;
        if ((((char)bVar17 < '\0') && (lVar22 = 2, (bVar17 & 0xe0) != 0xc0)) &&
           (lVar22 = 3, (bVar17 & 0xf0) != 0xe0)) {
          lVar22 = (ulong)((bVar17 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar3 + lVar21 + lVar22;
        iVar12 = iVar12 + -1;
        pbStack_50 = pbVar15;
      } while (iVar12 != 0);
    }
    sVar14 = sVar14 + 1;
  } while ((uVar16 != 0) || (iVar12 = yaml_parser_update_buffer(parser,1), iVar12 != 0));
LAB_0010ec0d:
  yaml_free(local_60);
  return 0;
}

Assistant:

static int
yaml_parser_scan_tag_uri(yaml_parser_t *parser, int directive,
        yaml_char_t *head, yaml_mark_t start_mark, yaml_char_t **uri)
{
    size_t length = head ? strlen((char *)head) : 0;
    yaml_string_t string = NULL_STRING;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;

    /* Resize the string to include the head. */

    while ((size_t)(string.end - string.start) <= length) {
        if (!yaml_string_extend(&string.start, &string.pointer, &string.end)) {
            parser->error = YAML_MEMORY_ERROR;
            goto error;
        }
    }

    /*
     * Copy the head if needed.
     *
     * Note that we don't copy the leading '!' character.
     */

    if (length > 1) {
        memcpy(string.start, head+1, length-1);
        string.pointer += length-1;
    }

    /* Scan the tag. */

    if (!CACHE(parser, 1)) goto error;

    /*
     * The set of characters that may appear in URI is as follows:
     *
     *      '0'-'9', 'A'-'Z', 'a'-'z', '_', '-', ';', '/', '?', ':', '@', '&',
     *      '=', '+', '$', ',', '.', '!', '~', '*', '\'', '(', ')', '[', ']',
     *      '%'.
     */

    while (IS_ALPHA(parser->buffer) || CHECK(parser->buffer, ';')
            || CHECK(parser->buffer, '/') || CHECK(parser->buffer, '?')
            || CHECK(parser->buffer, ':') || CHECK(parser->buffer, '@')
            || CHECK(parser->buffer, '&') || CHECK(parser->buffer, '=')
            || CHECK(parser->buffer, '+') || CHECK(parser->buffer, '$')
            || CHECK(parser->buffer, ',') || CHECK(parser->buffer, '.')
            || CHECK(parser->buffer, '!') || CHECK(parser->buffer, '~')
            || CHECK(parser->buffer, '*') || CHECK(parser->buffer, '\'')
            || CHECK(parser->buffer, '(') || CHECK(parser->buffer, ')')
            || CHECK(parser->buffer, '[') || CHECK(parser->buffer, ']')
            || CHECK(parser->buffer, '%'))
    {
        /* Check if it is a URI-escape sequence. */

        if (CHECK(parser->buffer, '%')) {
            if (!STRING_EXTEND(parser, string))
                goto error;

            if (!yaml_parser_scan_uri_escapes(parser,
                        directive, start_mark, &string)) goto error;
        }
        else {
            if (!READ(parser, string)) goto error;
        }

        length ++;
        if (!CACHE(parser, 1)) goto error;
    }

    /* Check if the tag is non-empty. */

    if (!length) {
        if (!STRING_EXTEND(parser, string))
            goto error;

        yaml_parser_set_scanner_error(parser, directive ?
                "while parsing a %TAG directive" : "while parsing a tag",
                start_mark, "did not find expected tag URI");
        goto error;
    }

    *uri = string.start;

    return 1;

error:
    STRING_DEL(parser, string);
    return 0;
}